

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O0

void __thiscall logfault::Handler::PrintMessage(Handler *this,ostream *out,Message *msg)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  string *psVar6;
  id __id;
  _Put_time<char> _Var7;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  duration<int,_std::ratio<1L,_1000L>_> local_58;
  rep_conflict local_54;
  tm *ptStack_50;
  int ms;
  tm *tm;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  duration local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point when_rounded;
  time_t tt;
  Message *msg_local;
  ostream *out_local;
  Handler *this_local;
  
  when_rounded.__d.__r = (duration)std::chrono::_V2::system_clock::to_time_t(&msg->when_);
  local_30.__d.__r =
       (duration)std::chrono::_V2::system_clock::from_time_t((time_t)when_rounded.__d.__r);
  bVar1 = std::chrono::operator>(&local_30,&msg->when_);
  if (bVar1) {
    when_rounded.__d.__r = (duration)((long)when_rounded.__d.__r + -1);
    tm._4_4_ = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_40,(int *)((long)&tm + 4));
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_38,&local_40);
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::operator-=(&local_30,&local_38);
  }
  ptStack_50 = localtime((time_t *)&when_rounded);
  if (ptStack_50 == (tm *)0x0) {
    std::operator<<(out,"0000-00-00 00:00:00.000");
  }
  else {
    local_60.__r = (rep)std::chrono::operator-(&msg->when_,&local_30);
    local_58.__r = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<int,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                             (&local_60);
    local_54 = std::chrono::duration<int,_std::ratio<1L,_1000L>_>::count(&local_58);
    _Var7 = std::put_time<char>((tm *)ptStack_50,"%Y-%m-%d %H:%M:%S.");
    pbVar4 = std::operator<<(out,_Var7);
    _Var3 = std::setw(3);
    poVar5 = std::operator<<(pbVar4,_Var3);
    _Var2 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var2._M_c);
    pbVar4 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(poVar5,local_54);
    _Var7 = std::put_time<char>((tm *)ptStack_50," %Z");
    std::operator<<(pbVar4,_Var7);
  }
  poVar5 = std::operator<<(out,' ');
  psVar6 = LevelName_abi_cxx11_(msg->level_);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  poVar5 = std::operator<<(poVar5,' ');
  __id = std::this_thread::get_id();
  pbVar4 = std::operator<<(poVar5,__id);
  poVar5 = std::operator<<(pbVar4,' ');
  std::operator<<(poVar5,(string *)msg);
  return;
}

Assistant:

void PrintMessage(std::ostream& out, const logfault::Message& msg) {
            auto tt = std::chrono::system_clock::to_time_t(msg.when_);
            auto when_rounded = std::chrono::system_clock::from_time_t(tt);
            if (when_rounded > msg.when_) {
                --tt;
                when_rounded -= std::chrono::seconds(1);
            }
            if (const auto tm = (LOGFAULT_USE_UTCZONE ? std::gmtime(&tt) : std::localtime(&tt))) {
                const int ms = std::chrono::duration_cast<std::chrono::duration<int, std::milli>>(msg.when_ - when_rounded).count();

                out << std::put_time(tm, LOGFAULT_TIME_FORMAT)
#if LOGFAULT_TIME_PRINT_MILLISECONDS
                    << std::setw(3) << std::setfill('0') << ms
#endif
#if LOGFAULT_TIME_PRINT_TIMEZONE
#   if LOGFAULT_USE_UTCZONE
                    << " UTC";
#   else
                    << std::put_time(tm, " %Z")
#   endif
#endif
                    ;
            } else {
                out << "0000-00-00 00:00:00.000";
            }

            out << ' ' << LevelName(msg.level_)
                << ' ' << LOGFAULT_THREAD_NAME
                << ' ' << msg.msg_;
        }